

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_server_connection.c
# Opt level: O1

int8_t json_server_connection_data(void *arg,uint8_t *dataBuf,uint32_t dataLen,uint32_t *parseLen)

{
  int8_t iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  dtl_dv_t *dv_value;
  uint32_t msgSize;
  char *key;
  char *local_38;
  
  if (arg == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    if (parseLen == (uint32_t *)0x0) {
      __assert_fail("parseLen != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/app/apx_node/src/json_server_connection.c"
                    ,0x85,
                    "int8_t json_server_connection_data(void *, const uint8_t *, uint32_t, uint32_t *)"
                   );
    }
    *parseLen = 0;
    puVar4 = (uint8_t *)numheader_decode32(dataBuf,dataBuf + dataLen);
    if ((dataBuf < puVar4) && (puVar4 <= dataBuf + dataLen)) {
      lVar5 = dtl_json_load_bstr(puVar4);
      if (lVar5 != 0) {
        iVar2 = dtl_dv_type(lVar5);
        if (iVar2 == 4) {
          dtl_hv_iter_init(lVar5);
          dv_value = (dtl_dv_t *)dtl_hv_iter_next_cstr(lVar5,&local_38);
          if (dv_value != (dtl_dv_t *)0x0) {
            do {
              if (*(apx_connection_t **)((long)arg + 8) == (apx_connection_t *)0x0) {
                uVar3 = 0x24;
              }
              else {
                uVar3 = apx_connection_writeProvidePortData
                                  (*(apx_connection_t **)((long)arg + 8),local_38,dv_value);
              }
              if (uVar3 != 0) {
                printf("%s: Write failed for signal with error code %d\n",local_38,(ulong)uVar3);
              }
              dv_value = (dtl_dv_t *)dtl_hv_iter_next_cstr(lVar5,&local_38);
            } while (dv_value != (dtl_dv_t *)0x0);
          }
        }
        dtl_dv_dec_ref(lVar5);
      }
      *parseLen = (int)puVar4 - (int)dataBuf;
    }
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

static int8_t json_server_connection_data(void *arg, const uint8_t *dataBuf, uint32_t dataLen, uint32_t *parseLen)
{
   json_server_connection_t *self = (json_server_connection_t*) arg;
   if (self != 0)
   {
      const uint8_t *pResult;
      const uint8_t *pEnd = dataBuf + dataLen;
      assert(parseLen != 0);
      uint32_t msgSize = 0u;
      *parseLen = 0;
      pResult = numheader_decode32(dataBuf, pEnd, &msgSize);
      if ( (pResult > dataBuf)  )
      {
         const uint8_t *pNext = pResult;
         if (pNext + msgSize <= pEnd)
         {
            json_server_connection_process_message(self, pNext, pNext+msgSize);
            pNext += msgSize;
            *parseLen = (uint32_t) (pNext - dataBuf);
         }
      }
      return 0;
   }
   return -1;
}